

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O2

void __thiscall read_wm_slot::operator()(read_wm_slot *this,wm_slot **_slot,xr_reader *r)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  wm_slot *value;
  
  value = (wm_slot *)operator_new(0x58);
  (value->shader)._M_dataplus._M_p = (pointer)&(value->shader).field_2;
  (value->shader)._M_string_length = 0;
  (value->shader).field_2._M_local_buf[0] = '\0';
  (value->texture)._M_dataplus._M_p = (pointer)&(value->texture).field_2;
  (value->texture)._M_string_length = 0;
  (value->texture).field_2._M_local_buf[0] = '\0';
  (value->wallmarks).super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (value->wallmarks).super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->wallmarks).super__Vector_base<xray_re::wm_data,_std::allocator<xray_re::wm_data>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_slot = value;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  uVar1 = *puVar2;
  xray_re::xr_reader::r_sz(r,(string *)value);
  xray_re::xr_reader::r_sz(r,&value->texture);
  xray_re::xr_reader::
  r_seq<std::vector<xray_re::wm_data,std::allocator<xray_re::wm_data>>,read_wm_data>
            (r,uVar1,&value->wallmarks);
  return;
}

Assistant:

void operator()(wm_slot*& _slot, xr_reader& r) const {
	wm_slot* slot = new wm_slot;
	_slot = slot;
	size_t n = r.r_u32();
	r.r_sz(slot->shader);
	r.r_sz(slot->texture);
	r.r_seq(n, slot->wallmarks, read_wm_data());
}